

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DiffuseAreaLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  Sphere *this_00;
  Curve *this_01;
  float fVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar13;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [56];
  undefined1 auVar22 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [56];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  SampledSpectrum SVar40;
  optional<pbrt::ShapeSample> ss;
  Tuple3<pbrt::Vector3,_float> local_118;
  undefined1 local_108 [52];
  Point2f local_d4 [4];
  bool local_b0;
  SampledSpectrum local_a0;
  Tuple3<pbrt::Point3,_float> local_90;
  RayDifferential local_80;
  
  uVar1 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  uVar11 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      Sphere::Sample((optional<pbrt::ShapeSample> *)local_108,this_00,u1);
    }
    else if (uVar11 == 2) {
      Cylinder::Sample((optional<pbrt::ShapeSample> *)local_108,(Cylinder *)this_00,u1);
    }
    else {
      Disk::Sample((optional<pbrt::ShapeSample> *)local_108,(Disk *)this_00,u1);
    }
  }
  else {
    uVar11 = uVar11 - 3;
    this_01 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar11 < 2) {
      Triangle::Sample((optional<pbrt::ShapeSample> *)local_108,(Triangle *)this_01,u1);
    }
    else if (uVar11 == 2) {
      BilinearPatch::Sample
                ((optional<pbrt::ShapeSample> *)local_108,(BilinearPatch *)this_01,
                 (Point2f)u1->super_Tuple2<pbrt::Point2,_float>);
    }
    else {
      Curve::Sample((optional<pbrt::ShapeSample> *)local_108,this_01,u1);
    }
  }
  if (local_b0 == false) goto LAB_003b68c1;
  local_d4._12_8_ = &(this->super_LightBase).mediumInterface;
  fVar13 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  local_108._24_4_ = time;
  if (this->twoSided == true) {
    fVar17 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
    if (0.5 <= fVar13) {
      auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar13 + -0.5 + fVar13 + -0.5)));
      auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar17),0x10);
      auVar19._0_4_ = auVar16._0_4_ + auVar16._0_4_;
      auVar19._4_4_ = auVar16._4_4_ + auVar16._4_4_;
      auVar19._8_4_ = auVar16._8_4_ + auVar16._8_4_;
      auVar19._12_4_ = auVar16._12_4_ + auVar16._12_4_;
      auVar2._8_4_ = 0xbf800000;
      auVar2._0_8_ = 0xbf800000bf800000;
      auVar2._12_4_ = 0xbf800000;
      auVar14 = vaddps_avx512vl(auVar19,auVar2);
      fVar13 = auVar14._0_4_;
      auVar16 = vmovshdup_avx(auVar14);
      fVar17 = auVar16._0_4_;
      if (fVar13 == 0.0) {
        auVar16 = ZEXT416(0) << 0x20;
        if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003b67f0;
      }
      else {
LAB_003b67f0:
        auVar7._8_4_ = 0x7fffffff;
        auVar7._0_8_ = 0x7fffffff7fffffff;
        auVar7._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar7);
        auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
        auVar30._0_4_ = fVar13 / fVar17;
        auVar30._4_12_ = auVar14._4_12_;
        bVar9 = auVar16._0_4_ < auVar15._0_4_;
        auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar30,ZEXT416(0x3fc90fdb));
        fVar12 = (float)((uint)bVar9 * (int)((fVar17 / fVar13) * 0.7853982) +
                        (uint)!bVar9 * auVar16._0_4_);
        fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar17);
        fVar17 = cosf(fVar12);
        fVar12 = sinf(fVar12);
        auVar16 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)(fVar13 * fVar12)),
                                0x10);
      }
      auVar14 = vmovshdup_avx(auVar16);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,auVar16);
      auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar14 = vxorps_avx512vl(auVar14,auVar8);
    }
    else {
      auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar13 + fVar13)));
      auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar17),0x10);
      auVar18._0_4_ = auVar16._0_4_ + auVar16._0_4_;
      auVar18._4_4_ = auVar16._4_4_ + auVar16._4_4_;
      auVar18._8_4_ = auVar16._8_4_ + auVar16._8_4_;
      auVar18._12_4_ = auVar16._12_4_ + auVar16._12_4_;
      auVar3._8_4_ = 0xbf800000;
      auVar3._0_8_ = 0xbf800000bf800000;
      auVar3._12_4_ = 0xbf800000;
      auVar14 = vaddps_avx512vl(auVar18,auVar3);
      fVar13 = auVar14._0_4_;
      auVar16 = vmovshdup_avx(auVar14);
      fVar17 = auVar16._0_4_;
      if (fVar13 == 0.0) {
        auVar16 = ZEXT416(0) << 0x20;
        if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003b6622;
      }
      else {
LAB_003b6622:
        auVar4._8_4_ = 0x7fffffff;
        auVar4._0_8_ = 0x7fffffff7fffffff;
        auVar4._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar4);
        auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
        auVar28._0_4_ = fVar13 / fVar17;
        auVar28._4_12_ = auVar14._4_12_;
        bVar9 = auVar16._0_4_ < auVar15._0_4_;
        auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar28,ZEXT416(0x3fc90fdb));
        fVar12 = (float)((uint)bVar9 * (int)((fVar17 / fVar13) * 0.7853982) +
                        (uint)!bVar9 * auVar16._0_4_);
        fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar17);
        fVar17 = cosf(fVar12);
        fVar12 = sinf(fVar12);
        auVar16 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)(fVar13 * fVar12)),
                                0x10);
      }
      auVar14 = vmovshdup_avx(auVar16);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,auVar16);
      auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(auVar14,auVar5);
    fVar13 = auVar15._0_4_ * 0.31830987 * 0.5;
  }
  else {
    auVar16 = vinsertps_avx(ZEXT416((uint)fVar13),
                            ZEXT416((uint)(u2->super_Tuple2<pbrt::Point2,_float>).y),0x10);
    auVar14._0_4_ = auVar16._0_4_ + auVar16._0_4_;
    auVar14._4_4_ = auVar16._4_4_ + auVar16._4_4_;
    auVar14._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    auVar14._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    auVar16._8_4_ = 0xbf800000;
    auVar16._0_8_ = 0xbf800000bf800000;
    auVar16._12_4_ = 0xbf800000;
    auVar14 = vaddps_avx512vl(auVar14,auVar16);
    fVar13 = auVar14._0_4_;
    auVar16 = vmovshdup_avx(auVar14);
    fVar17 = auVar16._0_4_;
    if (fVar13 == 0.0) {
      auVar16 = ZEXT416(0) << 0x20;
      if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003b66fa;
    }
    else {
LAB_003b66fa:
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(auVar14,auVar15);
      auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
      auVar29._0_4_ = fVar13 / fVar17;
      auVar29._4_12_ = auVar14._4_12_;
      bVar9 = auVar16._0_4_ < auVar15._0_4_;
      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar29,ZEXT416(0x3fc90fdb));
      fVar12 = (float)((uint)bVar9 * (int)((fVar17 / fVar13) * 0.7853982) +
                      (uint)!bVar9 * auVar16._0_4_);
      fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar17);
      fVar17 = cosf(fVar12);
      fVar12 = sinf(fVar12);
      auVar16 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)(fVar13 * fVar12)),0x10
                             );
    }
    auVar14 = vmovshdup_avx(auVar16);
    auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,auVar16);
    auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
    auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar13 = auVar14._0_4_ * 0.31830987;
  }
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    if (local_b0 != false) {
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = 0x3f8000003f800000;
      auVar39._12_4_ = 0x3f800000;
      auVar15 = vpternlogd_avx512vl(auVar33,ZEXT416((uint)local_108._48_4_),auVar31,0xf8);
      fVar32 = auVar15._0_4_;
      fVar24 = auVar14._0_4_;
      auVar34._0_4_ = -1.0 / ((float)local_108._48_4_ + fVar32);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_108._40_8_;
      auVar14 = vmovshdup_avx(auVar36);
      fVar35 = (float)local_108._40_8_;
      fVar37 = SUB84(local_108._40_8_,4);
      auVar38._0_4_ = fVar35 * fVar32 * fVar35;
      auVar38._4_4_ = fVar37 * 0.0;
      auVar38._8_8_ = 0;
      fVar12 = auVar16._0_4_;
      fVar17 = fVar35 * auVar14._0_4_ * auVar34._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar14 = vunpcklps_avx(auVar39,auVar15);
      auVar2 = vfmadd231ps_fma(auVar14,auVar38,auVar34);
      auVar14 = vinsertps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)(fVar32 * fVar17)),0x1c);
      auVar29 = vshufps_avx(auVar16,auVar16,0xe1);
      auVar20._0_4_ = fVar35 * fVar12;
      auVar20._4_4_ = fVar37 * auVar16._4_4_;
      auVar20._8_4_ = auVar16._8_4_ * 0.0;
      auVar20._12_4_ = auVar16._12_4_ * 0.0;
      auVar15 = vmovshdup_avx(auVar20);
      auVar25._0_4_ = fVar35 * fVar24 + fVar12 * auVar2._0_4_ + auVar29._0_4_ * auVar14._0_4_;
      auVar25._4_4_ = fVar37 * fVar24 + auVar16._4_4_ * auVar2._4_4_ + auVar29._4_4_ * auVar14._4_4_
      ;
      auVar25._8_4_ = fVar24 * 0.0 + auVar16._8_4_ * auVar2._8_4_ + auVar29._8_4_ * auVar14._8_4_;
      auVar25._12_4_ =
           fVar24 * 0.0 + auVar16._12_4_ * auVar2._12_4_ + auVar29._12_4_ * auVar14._12_4_;
      local_118.z = (fVar12 * fVar35 * -fVar32 - auVar15._0_4_) + (float)local_108._48_4_ * fVar24;
      local_118._0_8_ = vmovlps_avx(auVar25);
      auVar10._4_8_ = local_108._4_8_;
      auVar10._0_4_ = local_108._0_4_;
      auVar10._12_4_ = local_108._12_4_;
      auVar16 = vinsertps_avx(auVar10,ZEXT416((uint)local_108._12_4_),0x10);
      auVar21._0_4_ = (float)local_108._4_8_ + auVar16._0_4_;
      auVar21._4_4_ = SUB84(local_108._4_8_,4) + auVar16._4_4_;
      auVar21._8_4_ = auVar16._8_4_ + 0.0;
      auVar21._12_4_ = auVar16._12_4_ + 0.0;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar16 = vmulps_avx512vl(auVar21,auVar6);
      auVar23 = ZEXT856(auVar16._8_8_);
      local_90.z = ((float)local_108._16_4_ + (float)local_108._20_4_) * 0.5;
      auVar27 = (undefined1  [56])0x0;
      local_90._0_8_ = vmovlps_avx(auVar16);
      SVar40 = L(this,(Point3f *)&local_90,(Normal3f *)(local_108 + 0x28),local_d4,
                 (Vector3f *)&local_118,lambda);
      auVar26._0_8_ = SVar40.values.values._8_8_;
      auVar26._8_56_ = auVar27;
      auVar22._0_8_ = SVar40.values.values._0_8_;
      auVar22._8_56_ = auVar23;
      local_a0.values.values = (array<float,_4>)vmovlhps_avx(auVar22._0_16_,auVar26._0_16_);
      if ((local_b0 == true) &&
         (Interaction::SpawnRay(&local_80,(Interaction *)local_108,(Vector3f *)&local_118),
         local_b0 != false)) {
        LightLeSample::LightLeSample
                  (__return_storage_ptr__,&local_a0,&local_80.super_Ray,(Interaction *)local_108,
                   local_d4[3].super_Tuple2<pbrt::Point2,_float>.y,fVar13);
        return __return_storage_ptr__;
      }
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
LAB_003b68c1:
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
  *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
  __return_storage_ptr__->pdfPos = 0.0;
  __return_storage_ptr__->pdfDir = 0.0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DiffuseAreaLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    // Sample a point on the area light's _Shape_
    Float pdfDir;
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    if (twoSided) {
        Point2f u = u2;
        // Choose a side to sample and then remap u[0] to [0,1] before
        // applying cosine-weighted hemisphere sampling for the chosen side.
        if (u[0] < .5) {
            u[0] = std::min(u[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
        } else {
            u[0] = std::min((u[0] - .5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));
    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }

    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    Frame nFrame = Frame::FromZ(ss->intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(ss->intr.p(), ss->intr.n, ss->intr.uv, w, lambda),
                         ss->intr.SpawnRay(w), ss->intr, ss->pdf, pdfDir);
}